

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_fs_event_getpath(uv_fs_event_t *handle,char *buffer,size_t *size)

{
  size_t __n;
  size_t required_len;
  size_t *size_local;
  char *buffer_local;
  uv_fs_event_t *handle_local;
  
  if ((handle->flags & 0x4000) == 0) {
    *size = 0;
    handle_local._4_4_ = -0x16;
  }
  else {
    __n = strlen(handle->path);
    if (__n < *size) {
      memcpy(buffer,handle->path,__n);
      *size = __n;
      buffer[__n] = '\0';
      handle_local._4_4_ = 0;
    }
    else {
      *size = __n + 1;
      handle_local._4_4_ = -0x69;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_fs_event_getpath(uv_fs_event_t* handle, char* buffer, size_t* size) {
  size_t required_len;

  if (!uv__is_active(handle)) {
    *size = 0;
    return UV_EINVAL;
  }

  required_len = strlen(handle->path);
  if (required_len >= *size) {
    *size = required_len + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, handle->path, required_len);
  *size = required_len;
  buffer[required_len] = '\0';

  return 0;
}